

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O1

void secp256k1_heap_down(uchar *arr,size_t i,size_t heap_size,size_t stride,
                        _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  undefined8 uVar4;
  byte *pbVar5;
  uchar *puVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  byte *extraout_RDX;
  uchar *sigend;
  uchar *unaff_RBX;
  ulong unaff_RBP;
  secp256k1_context *r;
  ulong uVar11;
  int iStack_a4;
  ulong uStack_a0;
  uchar auStack_98 [40];
  uchar *puStack_70;
  size_t sStack_68;
  uchar *puStack_60;
  code *pcStack_58;
  code *pcStack_50;
  secp256k1_context *local_40;
  ulong local_38;
  
  local_38 = heap_size >> 1;
  r = (secp256k1_context *)arr;
  uVar10 = i;
  local_40 = (secp256k1_context *)stride;
  if (i < local_38) {
    do {
      uVar11 = uVar10 * 2 + 1;
      if (heap_size <= uVar11) {
        pcStack_50 = secp256k1_der_read_len;
        secp256k1_heap_down_cold_1();
        if (r == (secp256k1_context *)0x0) {
          pcStack_58 = secp256k1_der_parse_integer;
          secp256k1_der_read_len_cold_1();
          iStack_a4 = 0;
          auStack_98[0x10] = '\0';
          auStack_98[0x11] = '\0';
          auStack_98[0x12] = '\0';
          auStack_98[0x13] = '\0';
          auStack_98[0x14] = '\0';
          auStack_98[0x15] = '\0';
          auStack_98[0x16] = '\0';
          auStack_98[0x17] = '\0';
          auStack_98[0x18] = '\0';
          auStack_98[0x19] = '\0';
          auStack_98[0x1a] = '\0';
          auStack_98[0x1b] = '\0';
          auStack_98[0x1c] = '\0';
          auStack_98[0x1d] = '\0';
          auStack_98[0x1e] = '\0';
          auStack_98[0x1f] = '\0';
          auStack_98[0] = '\0';
          auStack_98[1] = '\0';
          auStack_98[2] = '\0';
          auStack_98[3] = '\0';
          auStack_98[4] = '\0';
          auStack_98[5] = '\0';
          auStack_98[6] = '\0';
          auStack_98[7] = '\0';
          auStack_98[8] = '\0';
          auStack_98[9] = '\0';
          auStack_98[10] = '\0';
          auStack_98[0xb] = '\0';
          auStack_98[0xc] = '\0';
          auStack_98[0xd] = '\0';
          auStack_98[0xe] = '\0';
          auStack_98[0xf] = '\0';
          puVar6 = *(uchar **)((secp256k1_pubkey *)i)->data;
          if ((puVar6 != sigend) && (*puVar6 == '\x02')) {
            *(uchar **)((secp256k1_pubkey *)i)->data = puVar6 + 1;
            puStack_70 = unaff_RBX;
            sStack_68 = heap_size;
            puStack_60 = arr;
            pcStack_58 = (code *)unaff_RBP;
            iVar8 = secp256k1_der_read_len(&uStack_a0,(uchar **)i,sigend);
            if ((((iVar8 != 0) &&
                 ((uStack_a0 != 0 &&
                  (pcVar7 = *(char **)((secp256k1_pubkey *)i)->data,
                  uStack_a0 <= (ulong)((long)sigend - (long)pcVar7))))) &&
                ((cVar3 = *pcVar7, uStack_a0 == 1 || cVar3 != '\0' || (pcVar7[1] < '\0')))) &&
               ((uStack_a0 == 1 || cVar3 != -1 || (-1 < pcVar7[1])))) {
              if (cVar3 < '\0') {
                iStack_a4 = 1;
              }
              if (*pcVar7 == '\0') {
                uStack_a0 = uStack_a0 - 1;
                *(char **)((secp256k1_pubkey *)i)->data = pcVar7 + 1;
              }
              if (0x20 < uStack_a0) {
                iStack_a4 = 1;
              }
              if (iStack_a4 == 0) {
                if (uStack_a0 != 0) {
                  memcpy(auStack_98 + (0x20 - uStack_a0),*(void **)((secp256k1_pubkey *)i)->data,
                         uStack_a0);
                }
                secp256k1_scalar_set_b32((secp256k1_scalar *)r,auStack_98,&iStack_a4);
              }
              if (iStack_a4 != 0) {
                (r->ecmult_gen_ctx).built = 0;
                secp256k1_scalar_verify((secp256k1_scalar *)r);
              }
              *(ulong *)((secp256k1_pubkey *)i)->data =
                   *(long *)((secp256k1_pubkey *)i)->data + uStack_a0;
            }
          }
          return;
        }
        (r->ecmult_gen_ctx).built = 0;
        (r->ecmult_gen_ctx).scalar_offset = 0;
        pbVar5 = *(byte **)((secp256k1_pubkey *)i)->data;
        if (pbVar5 < extraout_RDX) {
          pbVar1 = pbVar5 + 1;
          *(byte **)((secp256k1_pubkey *)i)->data = pbVar1;
          bVar2 = *pbVar5;
          uVar10 = (ulong)bVar2;
          if (uVar10 != 0xff) {
            if ((char)bVar2 < '\0') {
              if (bVar2 != 0x80) {
                uVar9 = bVar2 & 0x7f;
                uVar10 = (ulong)uVar9;
                if ((((uVar10 <= (ulong)((long)extraout_RDX - (long)pbVar1)) && ((byte)uVar9 < 9))
                    && (*pbVar1 != 0)) && (uVar10 != 0)) {
                  uVar11._0_4_ = (r->ecmult_gen_ctx).built;
                  uVar11._4_4_ = (r->ecmult_gen_ctx).scalar_offset;
                  pbVar5 = *(byte **)((secp256k1_pubkey *)i)->data;
                  do {
                    uVar11 = uVar11 << 8 | (ulong)*pbVar5;
                    (r->ecmult_gen_ctx).built = (int)uVar11;
                    (r->ecmult_gen_ctx).scalar_offset = (int)(uVar11 >> 0x20);
                    *(byte **)((secp256k1_pubkey *)i)->data = pbVar5 + 1;
                    uVar10 = uVar10 - 1;
                    pbVar5 = pbVar5 + 1;
                  } while (uVar10 != 0);
                }
              }
            }
            else {
              (r->ecmult_gen_ctx).built = (int)uVar10;
              (r->ecmult_gen_ctx).scalar_offset = (int)(uVar10 >> 0x20);
            }
          }
        }
        return;
      }
      unaff_RBP = uVar10 * 2 + 2;
      if (unaff_RBP < heap_size) {
        pcStack_50 = (code *)0x1170b7;
        iVar8 = secp256k1_ec_pubkey_cmp
                          (local_40,*(secp256k1_pubkey **)(arr + unaff_RBP * 8),
                           *(secp256k1_pubkey **)(arr + uVar11 * 8));
        if (iVar8 < 0) goto LAB_001170da;
        unaff_RBX = arr + unaff_RBP * 8;
        i = *(size_t *)unaff_RBX;
        pcStack_50 = (code *)0x1170d0;
        r = local_40;
        iVar8 = secp256k1_ec_pubkey_cmp
                          (local_40,(secp256k1_pubkey *)i,*(secp256k1_pubkey **)(arr + uVar10 * 8));
        if (iVar8 < 1) {
          return;
        }
      }
      else {
LAB_001170da:
        i = *(size_t *)(arr + uVar11 * 8);
        pcStack_50 = (code *)0x1170ec;
        r = local_40;
        iVar8 = secp256k1_ec_pubkey_cmp
                          (local_40,(secp256k1_pubkey *)i,*(secp256k1_pubkey **)(arr + uVar10 * 8));
        if (iVar8 < 1) {
          return;
        }
        unaff_RBX = arr + uVar11 * 8;
        unaff_RBP = uVar11;
      }
      uVar4 = *(undefined8 *)(arr + uVar10 * 8);
      *(undefined8 *)(arr + uVar10 * 8) = *(undefined8 *)unaff_RBX;
      *(undefined8 *)unaff_RBX = uVar4;
      uVar10 = unaff_RBP;
    } while (unaff_RBP < local_38);
  }
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_heap_down(unsigned char *arr, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(secp256k1_heap_child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at arr[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (secp256k1_heap_child2(i) < heap_size
                && 0 <= cmp(arr + secp256k1_heap_child2(i)*stride, arr + secp256k1_heap_child1(i)*stride, cmp_data)) {
            if (0 < cmp(arr + secp256k1_heap_child2(i)*stride, arr + i*stride, cmp_data)) {
                secp256k1_heap_swap(arr, i, secp256k1_heap_child2(i), stride);
                i = secp256k1_heap_child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(arr + secp256k1_heap_child1(i)*stride, arr +         i*stride, cmp_data)) {
            secp256k1_heap_swap(arr, i, secp256k1_heap_child1(i), stride);
            i = secp256k1_heap_child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}